

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_copy_to_file.cpp
# Opt level: O1

bool __thiscall
duckdb::PhysicalBatchCopyToFile::ExecuteTask
          (PhysicalBatchCopyToFile *this,ClientContext *context,GlobalSinkState *gstate_p)

{
  undefined8 uVar1;
  long *in_RAX;
  pointer pBVar2;
  pointer *__ptr;
  unique_ptr<duckdb::BatchCopyTask,_std::default_delete<duckdb::BatchCopyTask>,_true> task;
  undefined8 local_28;
  
  local_28 = in_RAX;
  BatchTaskManager<duckdb::BatchCopyTask>::GetTask
            ((BatchTaskManager<duckdb::BatchCopyTask> *)&stack0xffffffffffffffd8);
  uVar1 = local_28;
  if ((long *)local_28 != (long *)0x0) {
    pBVar2 = unique_ptr<duckdb::BatchCopyTask,_std::default_delete<duckdb::BatchCopyTask>,_true>::
             operator->((unique_ptr<duckdb::BatchCopyTask,_std::default_delete<duckdb::BatchCopyTask>,_true>
                         *)&stack0xffffffffffffffd8);
    (*pBVar2->_vptr_BatchCopyTask[2])(pBVar2,this,context,gstate_p);
  }
  if ((long *)local_28 != (long *)0x0) {
    (**(code **)(*(long *)local_28 + 8))();
  }
  return (long *)uVar1 != (long *)0x0;
}

Assistant:

bool PhysicalBatchCopyToFile::ExecuteTask(ClientContext &context, GlobalSinkState &gstate_p) const {
	auto &gstate = gstate_p.Cast<FixedBatchCopyGlobalState>();
	auto task = gstate.task_manager.GetTask();
	if (!task) {
		return false;
	}
	task->Execute(*this, context, gstate_p);
	return true;
}